

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_RUBBLE(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  player_upkeep *ppVar3;
  chunk_conflict *c;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  loc lVar8;
  wchar_t *pwVar9;
  wchar_t d;
  uint uVar10;
  long lVar11;
  wchar_t wVar12;
  bool bVar13;
  
  wVar5 = Rand_div(3);
  lVar8.x = (player->grid).x;
  lVar8.y = (player->grid).y;
  uVar10 = 0;
  wVar6 = count_neighbors((loc *)0x0,cave,lVar8,square_isempty,false);
  wVar12 = wVar5 + L'\x01';
  if (wVar6 <= wVar5) {
    wVar12 = wVar6;
  }
  if (L'\0' < wVar12) {
    do {
      lVar11 = 0;
      do {
        lVar8 = (loc)loc_sum(player->grid,(loc_conflict)ddgrid_ddd[lVar11]);
        _Var4 = square_in_bounds_fully(cave,lVar8);
        if (((_Var4) && (_Var4 = square_isempty(cave,lVar8), _Var4)) &&
           (uVar7 = Rand_div(3), uVar7 == 0)) {
          uVar7 = Rand_div(2);
          pwVar9 = &FEAT_RUBBLE;
          if (uVar7 == 0) {
            pwVar9 = &FEAT_PASS_RUBBLE;
          }
          square_set_feat(cave,lVar8,*pwVar9);
          c = cave;
          if (cave->depth == 0) {
            _Var4 = is_daytime();
            expose_to_sun((chunk *)c,lVar8,_Var4);
          }
          wVar12 = wVar12 + L'\xffffffff';
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
    } while ((L'\0' < wVar12) && (bVar13 = uVar10 < 9, uVar10 = uVar10 + 1, bVar13));
  }
  context->ident = true;
  ppVar3 = player->upkeep;
  puVar1 = &ppVar3->update;
  *puVar1 = *puVar1 | 0xc0;
  pbVar2 = (byte *)((long)&ppVar3->redraw + 2);
  *pbVar2 = *pbVar2 | 0xc0;
  return true;
}

Assistant:

bool effect_handler_RUBBLE(effect_handler_context_t *context)
{
	/*
	 * First we work out how many grids we want to fill with rubble.  Then we
	 * check that we can actually do this, by counting the number of grids
	 * available, limiting the number of rubble grids to this number if
	 * necessary.
	 */
	int rubble_grids = randint1(3);
	int open_grids = count_neighbors(NULL, cave, player->grid,
		square_isempty, false);

	if (rubble_grids > open_grids) {
		rubble_grids = open_grids;
	}

	/* Avoid infinite loops */
	int iterations = 0;

	while (rubble_grids > 0 && iterations < 10) {
		/* Look around the player */
		for (int d = 0; d < 8; d++) {
			/* Extract adjacent (legal) location */
			struct loc grid = loc_sum(player->grid, ddgrid_ddd[d]);
			if (!square_in_bounds_fully(cave, grid)) continue;
			if (!square_isempty(cave, grid)) continue;

			if (one_in_(3)) {
				if (one_in_(2))
					square_set_feat(cave, grid, FEAT_PASS_RUBBLE);
				else
					square_set_feat(cave, grid, FEAT_RUBBLE);
				if (cave->depth == 0)
					expose_to_sun(cave, grid, is_daytime());
				rubble_grids--;
			}
		}

		iterations++;
	}

	context->ident = true;

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw monster list */
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}